

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O1

bool __thiscall GNUmakeTokenPoolPosix::SetAlarmHandler(GNUmakeTokenPoolPosix *this)

{
  int iVar1;
  sigaction act;
  sigaction local_b0;
  
  memset(&local_b0,0,0x98);
  local_b0.__sigaction_handler.sa_handler = CloseDupRfd;
  iVar1 = sigaction(0xe,&local_b0,(sigaction *)&this->old_act_);
  if (iVar1 < 0) {
    perror("sigaction:");
  }
  else {
    this->restore_ = true;
  }
  return -1 < iVar1;
}

Assistant:

bool GNUmakeTokenPoolPosix::SetAlarmHandler() {
  struct sigaction act;
  memset(&act, 0, sizeof(act));
  act.sa_handler = CloseDupRfd;
  if (sigaction(SIGALRM, &act, &old_act_) < 0) {
    perror("sigaction:");
    return false;
  }
  restore_ = true;
  return true;
}